

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

iterator_range<llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>_> *
llvm::cl::getRegisteredSubcommands(void)

{
  CommandLineParser *pCVar1;
  iterator_range<llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>_> *in_RDI;
  SmallPtrSetIteratorImpl SVar2;
  SmallPtrSetIteratorImpl SVar3;
  
  pCVar1 = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
           ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                         *)in_RDI);
  SVar2 = (SmallPtrSetIteratorImpl)
          SmallPtrSetImpl<llvm::cl::SubCommand_*>::begin
                    (&(pCVar1->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>)
  ;
  SVar3 = (SmallPtrSetIteratorImpl)
          SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                    (&(pCVar1->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>)
  ;
  (in_RDI->begin_iterator).super_SmallPtrSetIteratorImpl = SVar2;
  (in_RDI->end_iterator).super_SmallPtrSetIteratorImpl = SVar3;
  return in_RDI;
}

Assistant:

iterator_range<typename SmallPtrSet<SubCommand *, 4>::iterator>
cl::getRegisteredSubcommands() {
  return GlobalParser->getRegisteredSubcommands();
}